

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_barrier_test.cc
# Opt level: O3

void __thiscall disruptor::test::SequenceBarrier::WaitForCursor::test_method(WaitForCursor *this)

{
  thread waiter2;
  undefined **local_148;
  undefined1 local_140;
  undefined8 *local_138;
  __atomic_base<long> **local_130;
  atomic<long> return_value;
  undefined8 *local_120;
  __atomic_base<long> *local_118;
  undefined **local_110;
  undefined1 local_108;
  undefined8 *local_100;
  undefined8 **local_f8;
  thread waiter;
  shared_count sStack_d8;
  char *local_d0;
  char *local_c8;
  undefined8 local_c0;
  __atomic_base<long> local_b8;
  undefined **local_b0;
  undefined1 local_a8;
  undefined8 *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  return_value.super___atomic_base<long>._M_i = (__atomic_base<long>)-1;
  waiter._M_id._M_thread = (id)0;
  local_148 = (undefined **)operator_new(0x18);
  *local_148 = (undefined *)&PTR___State_00109c50;
  local_148[1] = (undefined *)this;
  local_148[2] = (undefined *)&return_value;
  std::thread::_M_start_thread(&waiter,&local_148,0);
  if (local_148 != (undefined **)0x0) {
    (**(code **)(*local_148 + 8))();
  }
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/sequence_barrier_test.cc"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x46);
  local_a8 = 0;
  local_b0 = &PTR__lazy_ostream_00109bc0;
  local_a0 = &boost::unit_test::lazy_ostream::inst;
  local_98 = "";
  local_118 = (__atomic_base<long> *)&waiter2;
  waiter2._M_id._M_thread = (id)(id)return_value.super___atomic_base<long>._M_i;
  sStack_d8.pi_ = (sp_counted_base *)0x0;
  local_d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/sequence_barrier_test.cc"
  ;
  local_c8 = "";
  local_130 = &local_118;
  local_140 = 0;
  local_148 = &PTR__lazy_ostream_00109d70;
  local_138 = &boost::unit_test::lazy_ostream::inst;
  local_f8 = &local_120;
  local_120 = &kInitialCursorValue;
  local_108 = 0;
  local_110 = &PTR__lazy_ostream_00109d70;
  local_100 = &boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_d8);
  local_110 = (undefined **)0x0;
  local_148 = (undefined **)operator_new(0x10);
  *local_148 = (undefined *)&PTR___State_00109cb0;
  local_148[1] = (undefined *)this;
  std::thread::_M_start_thread(&local_110,&local_148,0);
  if (local_148 != (undefined **)0x0) {
    (**(code **)(*local_148 + 8))();
  }
  std::thread::join();
  if (local_110 != (undefined **)0x0) {
    std::terminate();
  }
  std::thread::join();
  local_60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/sequence_barrier_test.cc"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x49);
  local_a8 = 0;
  local_b0 = &PTR__lazy_ostream_00109bc0;
  local_a0 = &boost::unit_test::lazy_ostream::inst;
  local_98 = "";
  waiter2._M_id._M_thread = (id)(id)return_value.super___atomic_base<long>._M_i;
  sStack_d8.pi_ = (sp_counted_base *)0x0;
  local_d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/sequence_barrier_test.cc"
  ;
  local_c8 = "";
  local_118 = (__atomic_base<long> *)&waiter2;
  local_140 = 0;
  local_148 = &PTR__lazy_ostream_00109d70;
  local_138 = &boost::unit_test::lazy_ostream::inst;
  local_130 = &local_118;
  local_120 = &kFirstSequenceValue;
  local_108 = 0;
  local_110 = &PTR__lazy_ostream_00109d70;
  local_100 = &boost::unit_test::lazy_ostream::inst;
  local_f8 = &local_120;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_d8);
  waiter2._M_id._M_thread = (id)0;
  local_148 = (undefined **)operator_new(0x18);
  *local_148 = (undefined *)&PTR___State_00109cf0;
  local_148[1] = (undefined *)this;
  local_148[2] = (undefined *)&return_value;
  std::thread::_M_start_thread(&waiter2,&local_148,0);
  if (local_148 != (undefined **)0x0) {
    (**(code **)(*local_148 + 8))();
  }
  local_110 = (undefined **)0x0;
  local_148 = (undefined **)operator_new(0x10);
  *local_148 = (undefined *)&PTR___State_00109d30;
  local_148[1] = (undefined *)this;
  std::thread::_M_start_thread(&local_110,&local_148,0);
  if (local_148 != (undefined **)0x0) {
    (**(code **)(*local_148 + 8))();
  }
  std::thread::join();
  if (local_110 != (undefined **)0x0) {
    std::terminate();
  }
  std::thread::join();
  local_80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/sequence_barrier_test.cc"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x53);
  local_a8 = 0;
  local_b0 = &PTR__lazy_ostream_00109bc0;
  local_a0 = &boost::unit_test::lazy_ostream::inst;
  local_98 = "";
  local_118 = &local_b8;
  local_b8 = return_value.super___atomic_base<long>._M_i;
  local_120 = &local_c0;
  local_c0 = 1;
  sStack_d8.pi_ = (sp_counted_base *)0x0;
  local_d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/sequence_barrier_test.cc"
  ;
  local_c8 = "";
  local_140 = 0;
  local_148 = &PTR__lazy_ostream_00109d70;
  local_138 = &boost::unit_test::lazy_ostream::inst;
  local_130 = &local_118;
  local_108 = 0;
  local_110 = &PTR__lazy_ostream_00109d70;
  local_100 = &boost::unit_test::lazy_ostream::inst;
  local_f8 = &local_120;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_d8);
  if (waiter2._M_id._M_thread != 0) {
    std::terminate();
  }
  if (waiter._M_id._M_thread == 0) {
    return;
  }
  std::terminate();
}

Assistant:

BOOST_AUTO_TEST_CASE(WaitForCursor) {
  std::atomic<int64_t> return_value(kInitialCursorValue);

  std::thread waiter([this, &return_value]() {
    return_value.store(barrier.WaitFor(kFirstSequenceValue));
  });

  BOOST_CHECK_EQUAL(return_value.load(), kInitialCursorValue);
  std::thread([this]() { cursor.IncrementAndGet(1L); }).join();
  waiter.join();
  BOOST_CHECK_EQUAL(return_value.load(), kFirstSequenceValue);

  std::thread waiter2([this, &return_value]() {
    return_value.store(
        barrier.WaitFor(kFirstSequenceValue + 1L, std::chrono::seconds(5)));
  });

  std::thread([this]() { cursor.IncrementAndGet(1L); }).join();

  waiter2.join();
  BOOST_CHECK_EQUAL(return_value.load(), kFirstSequenceValue + 1L);
}